

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::FeedbackPrimitiveTypeCase::
getGeometrySource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  int iVar1;
  ostream *poVar2;
  RenderContext *pRVar3;
  int local_220;
  int local_21c;
  char *local_218;
  char *local_210;
  ContextType local_1ec;
  string local_1e8;
  undefined4 local_1c4;
  allocator<char> local_1bd [13];
  undefined1 local_1b0 [8];
  ostringstream buf;
  int numEmitVertices;
  int numSingleVertexOutputVertices;
  int numInputVertices;
  char *geometryOutputPrimitive;
  char *geometryInputPrimitive;
  FeedbackPrimitiveTypeCase *this_local;
  
  if (*(int *)((long)this + 0x7c) == 0) {
    local_210 = "triangles";
    if (*(int *)((long)this + 0x78) == 2) {
      local_210 = "lines";
    }
  }
  else {
    local_210 = "points";
  }
  if (*(int *)((long)this + 0x80) == 0) {
    local_218 = "points";
  }
  else {
    local_218 = "triangle_strip";
    if (*(int *)((long)this + 0x80) == 1) {
      local_218 = "line_strip";
    }
  }
  if (*(int *)((long)this + 0x7c) == 0) {
    local_21c = 3;
    if (*(int *)((long)this + 0x78) == 2) {
      local_21c = 2;
    }
  }
  else {
    local_21c = 1;
  }
  if (*(int *)((long)this + 0x80) == 0) {
    local_220 = 1;
  }
  else {
    local_220 = 3;
    if (*(int *)((long)this + 0x80) == 1) {
      local_220 = 4;
    }
  }
  buf._372_4_ = local_21c * local_220;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  poVar2 = std::operator<<((ostream *)local_1b0,
                           "${VERSION_DECL}\n${EXTENSION_GEOMETRY_SHADER}layout(");
  poVar2 = std::operator<<(poVar2,local_210);
  poVar2 = std::operator<<(poVar2,") in;\nlayout(");
  poVar2 = std::operator<<(poVar2,local_218);
  poVar2 = std::operator<<(poVar2,", max_vertices=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,buf._372_4_);
  std::operator<<(poVar2,
                  ") out;\n\nin highp vec4 v_tessellationCoords[];\nout highp vec4 tf_someVertexPosition;\n\nvoid main (void)\n{\n\t// Emit primitive\n\tfor (int ndx = 0; ndx < gl_in.length(); ++ndx)\n\t{\n"
                 );
  iVar1 = *(int *)((long)this + 0x80);
  if (iVar1 == 0) {
    std::operator<<((ostream *)local_1b0,
                    "\t\t// Draw point on vertex\n\t\tgl_Position = gl_in[ndx].gl_Position;\n\t\ttf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n\t\tEmitVertex();\n"
                   );
  }
  else if (iVar1 == 1) {
    std::operator<<((ostream *)local_1b0,
                    "\t\t// Draw cross on vertex\n\t\tgl_Position = gl_in[ndx].gl_Position + vec4(-0.02, -0.02, 0.0, 0.0);\n\t\ttf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n\t\tEmitVertex();\n\t\tgl_Position = gl_in[ndx].gl_Position + vec4( 0.02,  0.02, 0.0, 0.0);\n\t\ttf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n\t\tEmitVertex();\n\t\tEndPrimitive();\n\t\tgl_Position = gl_in[ndx].gl_Position + vec4( 0.02, -0.02, 0.0, 0.0);\n\t\ttf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n\t\tEmitVertex();\n\t\tgl_Position = gl_in[ndx].gl_Position + vec4(-0.02,  0.02, 0.0, 0.0);\n\t\ttf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n\t\tEmitVertex();\n\t\tEndPrimitive();\n"
                   );
  }
  else {
    if (iVar1 != 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",local_1bd);
      std::allocator<char>::~allocator(local_1bd);
      goto LAB_02298998;
    }
    std::operator<<((ostream *)local_1b0,
                    "\t\t// Draw triangle on vertex\n\t\tgl_Position = gl_in[ndx].gl_Position + vec4(  0.00, -0.02, 0.0, 0.0);\n\t\ttf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n\t\tEmitVertex();\n\t\tgl_Position = gl_in[ndx].gl_Position + vec4(  0.02,  0.00, 0.0, 0.0);\n\t\ttf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n\t\tEmitVertex();\n\t\tgl_Position = gl_in[ndx].gl_Position + vec4( -0.02,  0.00, 0.0, 0.0);\n\t\ttf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n\t\tEmitVertex();\n\t\tEndPrimitive();\n"
                   );
  }
  std::operator<<((ostream *)local_1b0,"\t}\n}\n");
  std::__cxx11::ostringstream::str();
  pRVar3 = gles31::Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_1ec.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  anon_unknown_1::specializeShader(__return_storage_ptr__,&local_1e8,&local_1ec);
  std::__cxx11::string::~string((string *)&local_1e8);
LAB_02298998:
  local_1c4 = 1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string FeedbackPrimitiveTypeCase::getGeometrySource (void) const
{
	const char* const	geometryInputPrimitive			= (m_tessellationPointMode) ? ("points") : (m_tessellationOutput == TESSELLATION_OUT_ISOLINES) ? ("lines") : ("triangles");
	const char* const	geometryOutputPrimitive			= (m_geometryOutputType == GEOMETRY_OUTPUT_POINTS) ? ("points") : (m_geometryOutputType == GEOMETRY_OUTPUT_LINES) ? ("line_strip") : ("triangle_strip");
	const int			numInputVertices				= (m_tessellationPointMode) ? (1) : (m_tessellationOutput == TESSELLATION_OUT_ISOLINES) ? (2) : (3);
	const int			numSingleVertexOutputVertices	= (m_geometryOutputType == GEOMETRY_OUTPUT_POINTS) ? (1) : (m_geometryOutputType == GEOMETRY_OUTPUT_LINES) ? (4) : (3);
	const int			numEmitVertices					= numInputVertices * numSingleVertexOutputVertices;
	std::ostringstream	buf;

	buf <<	"${VERSION_DECL}\n"
			"${EXTENSION_GEOMETRY_SHADER}"
			"layout(" << geometryInputPrimitive << ") in;\n"
			"layout(" << geometryOutputPrimitive << ", max_vertices=" << numEmitVertices <<") out;\n"
			"\n"
			"in highp vec4 v_tessellationCoords[];\n"
			"out highp vec4 tf_someVertexPosition;\n"
			"\n"
			"void main (void)\n"
			"{\n"
			"	// Emit primitive\n"
			"	for (int ndx = 0; ndx < gl_in.length(); ++ndx)\n"
			"	{\n";

	switch (m_geometryOutputType)
	{
		case GEOMETRY_OUTPUT_POINTS:
			buf <<	"		// Draw point on vertex\n"
					"		gl_Position = gl_in[ndx].gl_Position;\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n";
			break;

		case GEOMETRY_OUTPUT_LINES:
			buf <<	"		// Draw cross on vertex\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(-0.02, -0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4( 0.02,  0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		EndPrimitive();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4( 0.02, -0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(-0.02,  0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		EndPrimitive();\n";
			break;

		case GEOMETRY_OUTPUT_TRIANGLES:
			buf <<	"		// Draw triangle on vertex\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(  0.00, -0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(  0.02,  0.00, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4( -0.02,  0.00, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		EndPrimitive();\n";
			break;

		default:
			DE_ASSERT(false);
			return "";
	}

	buf <<	"	}\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}